

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O2

string * __thiscall
loguru::stacktrace_as_stdstring_abi_cxx11_(string *__return_storage_ptr__,loguru *this,int skip)

{
  long lVar1;
  int iVar2;
  void *__ptr;
  char *__ptr_00;
  undefined4 in_register_00000014;
  long lVar3;
  void *pvVar4;
  char *pcVar5;
  uint uVar6;
  int status;
  int local_884;
  string result;
  Dl_info info;
  void *callstack [128];
  char buf [1024];
  
  iVar2 = backtrace(callstack,0x80,CONCAT44(in_register_00000014,skip));
  __ptr = (void *)backtrace_symbols(callstack,iVar2);
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  uVar6 = iVar2 + ~(uint)this;
  lVar1 = (long)iVar2;
  local_884 = iVar2;
  while (lVar3 = lVar1 + -1, (int)(uint)this < lVar1) {
    iVar2 = dladdr(callstack[lVar3],&info);
    if (info.dli_sname == (char *)0x0 || iVar2 == 0) {
      snprintf(buf,0x400,"%-3d %*p %s\n",(ulong)uVar6,0x12,callstack[lVar3],
               *(undefined8 *)((long)__ptr + lVar3 * 8));
    }
    else {
      status = -1;
      if (*info.dli_sname == '_') {
        __ptr_00 = (char *)__cxa_demangle(info.dli_sname,0,0,&status);
        pvVar4 = callstack[lVar3];
        pcVar5 = __ptr_00;
        if ((status != 0) && (pcVar5 = info.dli_sname, info.dli_sname == (char *)0x0)) {
          pcVar5 = *(char **)((long)__ptr + lVar3 * 8);
        }
      }
      else {
        pvVar4 = callstack[lVar3];
        __ptr_00 = (char *)0x0;
        pcVar5 = info.dli_sname;
      }
      snprintf(buf,0x400,"%-3d %*p %s + %zd\n",(ulong)uVar6,0x12,pvVar4,pcVar5,
               (long)pvVar4 - (long)info.dli_saddr);
      free(__ptr_00);
    }
    std::__cxx11::string::append((char *)&result);
    uVar6 = uVar6 - 1;
    lVar1 = lVar3;
  }
  free(__ptr);
  if (local_884 == 0x80) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,
                   "[truncated]\n",&result);
    std::__cxx11::string::operator=((string *)&result,(string *)buf);
    std::__cxx11::string::~string((string *)buf);
  }
  if ((result._M_string_length != 0) &&
     (result._M_dataplus._M_p[result._M_string_length - 1] == '\n')) {
    std::__cxx11::string::resize((ulong)&result);
  }
  prettify_stacktrace(__return_storage_ptr__,&result);
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

std::string stacktrace_as_stdstring(int skip)
	{
		// From https://gist.github.com/fmela/591333
		void* callstack[128];
		const auto max_frames = sizeof(callstack) / sizeof(callstack[0]);
		int num_frames = backtrace(callstack, max_frames);
		char** symbols = backtrace_symbols(callstack, num_frames);

		std::string result;
		// Print stack traces so the most relevant ones are written last
		// Rationale: http://yellerapp.com/posts/2015-01-22-upside-down-stacktraces.html
		for (int i = num_frames - 1; i >= skip; --i) {
			char buf[1024];
			Dl_info info;
			if (dladdr(callstack[i], &info) && info.dli_sname) {
				char* demangled = NULL;
				int status = -1;
				if (info.dli_sname[0] == '_') {
					demangled = abi::__cxa_demangle(info.dli_sname, 0, 0, &status);
				}
				snprintf(buf, sizeof(buf), "%-3d %*p %s + %zd\n",
						 i - skip, int(2 + sizeof(void*) * 2), callstack[i],
						 status == 0 ? demangled :
						 info.dli_sname == 0 ? symbols[i] : info.dli_sname,
						 static_cast<char*>(callstack[i]) - static_cast<char*>(info.dli_saddr));
				free(demangled);
			} else {
				snprintf(buf, sizeof(buf), "%-3d %*p %s\n",
						 i - skip, int(2 + sizeof(void*) * 2), callstack[i], symbols[i]);
			}
			result += buf;
		}
		free(symbols);

		if (num_frames == max_frames) {
			result = "[truncated]\n" + result;
		}

		if (!result.empty() && result[result.size() - 1] == '\n') {
			result.resize(result.size() - 1);
		}

		return prettify_stacktrace(result);
	}